

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

bool anon_unknown.dwarf_59d9::remove_file_or_directory(path *p,file_type type,error_code *ec)

{
  bool bVar1;
  int iVar2;
  error_category *peVar3;
  int *piVar4;
  err_t error_num;
  
  if (type == directory_file) {
    iVar2 = rmdir((p->m_pathname)._M_dataplus._M_p);
  }
  else {
    if (type == file_not_found) {
      if (ec == (error_code *)0x0) {
        return false;
      }
      ec->m_val = 0;
      peVar3 = boost::system::system_category();
      ec->m_cat = peVar3;
      return false;
    }
    iVar2 = unlink((p->m_pathname)._M_dataplus._M_p);
  }
  error_num = 0;
  if (iVar2 != 0) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    error_num = 0;
    if ((iVar2 != 2) && (iVar2 != 0x14)) {
      error_num = iVar2;
    }
  }
  bVar1 = error(error_num,p,ec,"boost::filesystem::remove");
  if (bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool remove_file_or_directory(const path& p, fs::file_type type, error_code* ec)
    // return true if file removed, false if not removed
  {
    if (type == fs::file_not_found)
    {
      if (ec != 0) ec->clear();
      return false;
    }

    if (type == fs::directory_file
#     ifdef BOOST_WINDOWS_API
        || type == fs::_detail_directory_symlink
#     endif
      )
    {
      if (error(!remove_directory(p) ? BOOST_ERRNO : 0, p, ec,
        "boost::filesystem::remove"))
          return false;
    }
    else
    {
      if (error(!remove_file(p) ? BOOST_ERRNO : 0, p, ec,
        "boost::filesystem::remove"))
          return false;
    }
    return true;
  }